

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferOperations.cpp
# Opt level: O0

void __thiscall glcts::TextureBufferOperations::initFirstPhase(TextureBufferOperations *this)

{
  bool bVar1;
  int iVar2;
  GLuint GVar3;
  deUint32 dVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  TestError *this_00;
  char *local_40;
  char *csCode;
  string csSource;
  Functions *gl;
  TextureBufferOperations *this_local;
  
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar2 = (*pRVar5->_vptr_RenderContext[3])();
  csSource.field_2._8_8_ = CONCAT44(extraout_var,iVar2);
  GVar3 = (**(code **)(csSource.field_2._8_8_ + 0x3c8))();
  this->m_po_cs_id = GVar3;
  dVar4 = (**(code **)(csSource.field_2._8_8_ + 0x800))();
  glu::checkError(dVar4,"Error creating program object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                  ,0x83);
  GVar3 = (**(code **)(csSource.field_2._8_8_ + 0x3f0))(0x91b9);
  this->m_cs_id = GVar3;
  dVar4 = (**(code **)(csSource.field_2._8_8_ + 0x800))();
  glu::checkError(dVar4,"Error creating shader object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                  ,0x86);
  getComputeShaderCode_abi_cxx11_((string *)&csCode,this);
  local_40 = (char *)std::__cxx11::string::c_str();
  bVar1 = TestCaseBase::buildProgram
                    (&this->super_TestCaseBase,this->m_po_cs_id,this->m_cs_id,1,&local_40,
                     (bool *)0x0);
  if (!bVar1) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Could not create a program from valid compute shader code!",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
               ,0x8d);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (**(code **)(csSource.field_2._8_8_ + 0x6c8))(1,&this->m_ssbo_bo_id);
  dVar4 = (**(code **)(csSource.field_2._8_8_ + 0x800))();
  glu::checkError(dVar4,"Error generating buffer object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                  ,0x92);
  (**(code **)(csSource.field_2._8_8_ + 0x40))(0x8892,this->m_ssbo_bo_id);
  dVar4 = (**(code **)(csSource.field_2._8_8_ + 0x800))();
  glu::checkError(dVar4,"Error binding  buffer object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                  ,0x94);
  (**(code **)(csSource.field_2._8_8_ + 0x150))
            (0x8892,(ulong)(uint)(this->m_n_vectors_in_buffer_texture << 2) << 2,0,0x88e8);
  dVar4 = (**(code **)(csSource.field_2._8_8_ + 0x800))();
  glu::checkError(dVar4,"Error allocating data store for buffer object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                  ,0x97);
  (**(code **)(csSource.field_2._8_8_ + 0x40))(0x8892,0);
  dVar4 = (**(code **)(csSource.field_2._8_8_ + 0x800))();
  glu::checkError(dVar4,"Error binding  buffer object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                  ,0x99);
  std::__cxx11::string::~string((string *)&csCode);
  return;
}

Assistant:

void TextureBufferOperations::initFirstPhase(void)
{
	/* Get GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Create program object */
	m_po_cs_id = gl.createProgram();
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error creating program object!");

	m_cs_id = gl.createShader(GL_COMPUTE_SHADER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error creating shader object!");

	std::string csSource = getComputeShaderCode();
	const char* csCode   = csSource.c_str();

	if (!buildProgram(m_po_cs_id, m_cs_id, 1, &csCode))
	{
		TCU_FAIL("Could not create a program from valid compute shader code!");
	}

	/* Create Shader Storage Buffer Object */
	gl.genBuffers(1, &m_ssbo_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error generating buffer object!");
	gl.bindBuffer(GL_ARRAY_BUFFER, m_ssbo_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding  buffer object!");
	gl.bufferData(GL_ARRAY_BUFFER, m_n_vectors_in_buffer_texture * m_n_vector_components * sizeof(glw::GLint), 0,
				  GL_DYNAMIC_DRAW);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error allocating data store for buffer object!");
	gl.bindBuffer(GL_ARRAY_BUFFER, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding  buffer object!");
}